

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::MakeIfdefGuardIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view header_path)

{
  AlphaNum *b;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  AlphaNum local_158;
  undefined1 local_118 [64];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d8;
  AlphaNum *local_b8;
  undefined8 local_b0;
  _anonymous_namespace_ *local_a8;
  size_t sStack_a0;
  string local_90;
  string local_70;
  AlphaNum local_50;
  _anonymous_namespace_ *p_Stack_20;
  string_view header_path_local;
  
  sStack_a0 = header_path._M_len;
  b = (AlphaNum *)local_118;
  local_a8 = this;
  p_Stack_20 = this;
  header_path_local._M_len = sStack_a0;
  header_path_local._M_str = (char *)__return_storage_ptr__;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)b,(char (*) [2])0x20204c1,(char (*) [2])0x1cf2682);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)(local_118 + 0x20),(char (*) [2])0x2073f9e,(char (*) [2])0x1cf2682);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_d8,(char (*) [2])0x1df5de0,(char (*) [2])0x1cf2682);
  local_b0 = 3;
  s._M_str = (char *)b;
  s._M_len = sStack_a0;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x3;
  local_b8 = b;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_90,(lts_20250127 *)local_a8,s,replacements);
  absl::lts_20250127::AsciiStrToUpper<>(&local_70,&local_90);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_158,"_");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_50,&local_158,b);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string MakeIfdefGuardIdentifier(const absl::string_view header_path) {
  return absl::StrCat(absl::AsciiStrToUpper(absl::StrReplaceAll(header_path,
                                                                {
                                                                    {"/", "_"},
                                                                    {".", "_"},
                                                                    {"-", "_"},
                                                                })),
                      "_");
}